

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_BytesConstructor_Test::~ByteData160_BytesConstructor_Test
          (ByteData160_BytesConstructor_Test *this)

{
  ByteData160_BytesConstructor_Test *this_local;
  
  ~ByteData160_BytesConstructor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, BytesConstructor) {
  std::vector<uint8_t> target(20);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData160 byte_data = ByteData160(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_TRUE(is_equals);
  auto copy_data = byte_data;
  EXPECT_TRUE(copy_data == byte_data);
}